

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

RAMBlock *
qemu_ram_alloc_from_ptr_aarch64(uc_struct_conflict2 *uc,ram_addr_t size,void *host,MemoryRegion *mr)

{
  anon_struct_8_1_e05e5bab_for_blocks *paVar1;
  uc_struct *uc_00;
  RAMBlock *pRVar2;
  ulong uVar3;
  RAMBlock **ppRVar4;
  ram_addr_t rVar5;
  RAMBlock *mem;
  RAMBlock *pRVar6;
  uint8_t *puVar7;
  ram_addr_t rVar8;
  long lVar9;
  ulong uVar10;
  anon_struct_16_2_6a822a49_for_next *paVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (host == (void *)0x0) {
    size = -uc->qemu_host_page_size & (size + uc->qemu_host_page_size) - 1;
  }
  mem = (RAMBlock *)g_malloc0(0x48);
  if (mem == (RAMBlock *)0x0) {
    return (RAMBlock *)0x0;
  }
  mem->mr = mr;
  mem->used_length = size;
  mem->max_length = size;
  mem->page_size = uc->qemu_real_host_page_size;
  mem->host = (uint8_t *)host;
  if (host != (void *)0x0) {
    *(byte *)&mem->flags = (byte)mem->flags | 1;
  }
  uc->invalid_addr = 0;
  if (size == 0) {
    __assert_fail("size != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                  ,0x3d6,"ram_addr_t find_ram_offset(struct uc_struct *, ram_addr_t)");
  }
  uc_00 = (uc_struct *)mr->uc;
  paVar1 = &(uc_00->ram_list).blocks;
  pRVar6 = (uc_00->ram_list).blocks.lh_first;
  if (pRVar6 == (RAMBlock *)0x0) {
    rVar8 = 0;
  }
  else if ((uc_00->ram_list).freed == false) {
    rVar8 = 0;
    while (pRVar6 != (RAMBlock *)0x0) {
      uVar10 = pRVar6->max_length + pRVar6->offset;
      pRVar6 = (pRVar6->next).le_next;
      if (rVar8 < uVar10) {
        rVar8 = uVar10;
      }
    }
  }
  else {
    lVar9 = 0x40L << ((byte)uc_00->init_target_page->bits & 0x3f);
    rVar5 = 0xffffffffffffffff;
    rVar8 = rVar5;
    uVar10 = rVar5;
    for (; pRVar6 != (RAMBlock *)0x0; pRVar6 = (pRVar6->next).le_next) {
      uVar12 = pRVar6->offset + lVar9 + -1 + pRVar6->max_length & -lVar9;
      uVar13 = rVar5;
      paVar11 = (anon_struct_16_2_6a822a49_for_next *)paVar1;
      while (pRVar2 = paVar11->le_next, pRVar2 != (RAMBlock *)0x0) {
        uVar3 = pRVar2->offset;
        uVar14 = uVar3;
        if (uVar13 < uVar3) {
          uVar14 = uVar13;
        }
        if (uVar12 <= uVar3) {
          uVar13 = uVar14;
        }
        paVar11 = &pRVar2->next;
      }
      uVar13 = uVar13 - uVar12;
      if (size <= uVar13 && uVar13 < uVar10) {
        uVar10 = uVar13;
        rVar8 = uVar12;
      }
    }
    if (rVar8 == 0xffffffffffffffff) {
      fprintf(_stderr,"Failed to find gap of requested size: %lu\n",size);
      abort();
    }
  }
  mem->offset = rVar8;
  if (host == (void *)0x0) {
    puVar7 = (uint8_t *)qemu_anon_ram_alloc(uc_00,size,&mr->align);
    mem->host = puVar7;
    if (puVar7 == (uint8_t *)0x0) {
      uc_00->invalid_error = 1;
      goto LAB_00577d55;
    }
  }
  pRVar6 = (RAMBlock *)0x0;
  paVar11 = (anon_struct_16_2_6a822a49_for_next *)paVar1;
  while (pRVar2 = paVar11->le_next, pRVar2 != (RAMBlock *)0x0) {
    if (pRVar2->max_length < mem->max_length) {
      ppRVar4 = (pRVar2->next).le_prev;
      (mem->next).le_prev = ppRVar4;
      (mem->next).le_next = pRVar2;
      *ppRVar4 = mem;
      (pRVar2->next).le_prev = &(mem->next).le_next;
      goto LAB_00577d4d;
    }
    pRVar6 = pRVar2;
    paVar11 = &pRVar2->next;
  }
  if (pRVar6 == (RAMBlock *)0x0) {
    (mem->next).le_prev = &paVar1->lh_first;
    (mem->next).le_next = paVar1->lh_first;
    paVar1->lh_first = mem;
  }
  else {
    (mem->next).le_next = (pRVar6->next).le_next;
    (mem->next).le_prev = &(pRVar6->next).le_next;
    (pRVar6->next).le_next = mem;
  }
  pRVar6 = (mem->next).le_next;
  if (pRVar6 != (RAMBlock *)0x0) {
    (pRVar6->next).le_prev = &(mem->next).le_next;
  }
LAB_00577d4d:
  (uc_00->ram_list).mru_block = (RAMBlock *)0x0;
LAB_00577d55:
  if (uc->invalid_error != 0) {
    g_free(mem);
    return (RAMBlock *)0x0;
  }
  return mem;
}

Assistant:

RAMBlock *qemu_ram_alloc_from_ptr(struct uc_struct *uc, ram_addr_t size, void *host,
                                   MemoryRegion *mr)
{
    RAMBlock *new_block;
    ram_addr_t max_size = size;

    // Don't resize pre-alloced memory as they are given by users.
    if (!host) {
        size = HOST_PAGE_ALIGN(uc, size);
        max_size = HOST_PAGE_ALIGN(uc, max_size);
    }

    new_block = g_malloc0(sizeof(*new_block));
    if (new_block == NULL)
        return NULL;
    new_block->mr = mr;
    new_block->used_length = size;
    new_block->max_length = max_size;
    assert(max_size >= size);
    new_block->page_size = uc->qemu_real_host_page_size;
    new_block->host = host;
    if (host) {
        new_block->flags |= RAM_PREALLOC;
    }

    uc->invalid_addr = UC_ERR_OK;
    ram_block_add(mr->uc, new_block);

    if (uc->invalid_error != UC_ERR_OK) {
        g_free(new_block);
        return NULL;
    }

    return new_block;
}